

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

bool __thiscall
btSingleContactCallback::process(btSingleContactCallback *this,btBroadphaseProxy *proxy)

{
  btCollisionObject *pbVar1;
  btDispatcher *pbVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  btCollisionObjectWrapper ob1;
  btCollisionObjectWrapper ob0;
  btBridgedManifoldResult contactPointResult;
  btCollisionObjectWrapper local_b0;
  btCollisionObjectWrapper local_88;
  btBridgedManifoldResult local_60;
  long *plVar5;
  
  pbVar1 = (btCollisionObject *)proxy->m_clientObject;
  if (pbVar1 != this->m_collisionObject) {
    cVar3 = (**(code **)(*(long *)this->m_resultCallback + 0x10))
                      (this->m_resultCallback,pbVar1->m_broadphaseHandle);
    if (cVar3 != '\0') {
      local_88.m_collisionObject = this->m_collisionObject;
      local_88.m_shape = (local_88.m_collisionObject)->m_collisionShape;
      local_88.m_parent = (btCollisionObjectWrapper *)0x0;
      local_88.m_worldTransform = &(local_88.m_collisionObject)->m_worldTransform;
      local_88.m_partId = -1;
      local_88.m_index = -1;
      local_b0.m_shape = pbVar1->m_collisionShape;
      local_b0.m_parent = (btCollisionObjectWrapper *)0x0;
      local_b0.m_worldTransform = &pbVar1->m_worldTransform;
      local_b0.m_partId = -1;
      local_b0.m_index = -1;
      local_b0.m_collisionObject = pbVar1;
      iVar4 = (*this->m_world->m_dispatcher1->_vptr_btDispatcher[2])();
      plVar5 = (long *)CONCAT44(extraout_var,iVar4);
      if (plVar5 != (long *)0x0) {
        btBridgedManifoldResult::btBridgedManifoldResult
                  (&local_60,&local_88,&local_b0,this->m_resultCallback);
        (**(code **)(*plVar5 + 0x10))
                  (plVar5,&local_88,&local_b0,&this->m_world->m_dispatchInfo,&local_60);
        (**(code **)*plVar5)(plVar5);
        pbVar2 = this->m_world->m_dispatcher1;
        (*pbVar2->_vptr_btDispatcher[0xf])(pbVar2,plVar5);
      }
    }
  }
  return true;
}

Assistant:

virtual bool	process(const btBroadphaseProxy* proxy)
	{
		btCollisionObject*	collisionObject = (btCollisionObject*)proxy->m_clientObject;
		if (collisionObject == m_collisionObject)
			return true;

		//only perform raycast if filterMask matches
		if(m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) 
		{
			btCollisionObjectWrapper ob0(0,m_collisionObject->getCollisionShape(),m_collisionObject,m_collisionObject->getWorldTransform(),-1,-1);
			btCollisionObjectWrapper ob1(0,collisionObject->getCollisionShape(),collisionObject,collisionObject->getWorldTransform(),-1,-1);

			btCollisionAlgorithm* algorithm = m_world->getDispatcher()->findAlgorithm(&ob0,&ob1);
			if (algorithm)
			{
				btBridgedManifoldResult contactPointResult(&ob0,&ob1, m_resultCallback);
				//discrete collision detection query
				
				algorithm->processCollision(&ob0,&ob1, m_world->getDispatchInfo(),&contactPointResult);

				algorithm->~btCollisionAlgorithm();
				m_world->getDispatcher()->freeCollisionAlgorithm(algorithm);
			}
		}
		return true;
	}